

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::stream_tmp(SSPMSolver *this,ostream *out,int h)

{
  int iVar1;
  ostream *this_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  if (*this->tmp_d == -1) {
    pcVar5 = " \x1b[1;33mTop\x1b[m";
    lVar8 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (0 < h) {
      iVar2 = 0;
      lVar8 = 0;
      do {
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        bVar10 = true;
        if ((int)lVar8 < this->l) {
          lVar8 = (long)(int)lVar8;
          iVar9 = 0;
          do {
            if (this->tmp_d[lVar8] != iVar2) goto LAB_00167223;
            iVar9 = iVar9 + 1;
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar8 = lVar8 + 1;
          } while (lVar8 < this->l);
          iVar9 = 1;
LAB_00167223:
          bVar10 = iVar9 == 0;
        }
        if (bVar10) {
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_237526,2);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 != h);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
    std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
    if (0 < h) {
      iVar9 = 0;
      iVar2 = 0;
      do {
        iVar1 = this->l;
        if (iVar2 < iVar1) {
          uVar4 = (ulong)iVar2;
          iVar3 = -iVar2;
          uVar7 = 0;
          do {
            if (this->tmp_d[uVar4] != iVar9) {
              iVar2 = -iVar3;
              uVar7 = uVar7 | ~(-1 << (iVar1 + iVar3 & 0x1fU));
              goto LAB_001672f7;
            }
            uVar6 = 1 << (iVar1 + iVar3 & 0x1fU);
            if (((this->tmp_b)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
              uVar6 = 0;
            }
            uVar7 = uVar7 | uVar6;
            uVar4 = uVar4 + 1;
            iVar3 = iVar3 + -1;
          } while (iVar1 + iVar3 != 0);
          iVar2 = -iVar3;
        }
        else {
          uVar7 = 0;
        }
LAB_001672f7:
        this_00 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
        std::ostream::operator<<(this_00,uVar7);
        iVar9 = iVar9 + 1;
      } while (iVar9 != h);
    }
    pcVar5 = " }";
    lVar8 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,lVar8);
  return;
}

Assistant:

void
SSPMSolver::stream_tmp(std::ostream &out, int h)
{
    if (tmp_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and tmp_d[j] == i) {
                c++;
                out << tmp_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";

        out << " {";

        // compute value
        int i=0;
        for (int d=0; d<h; d++) {
            int val = 0;

            for (; i<l; i++) {
                if (tmp_d[i] != d) {
                    // e found
                    val |= ((1 << (l-i)) - 1);
                    break;
                }

                if (tmp_b[i]) val |= (1 << (l-i));
            }

            logger << " " << val;
        }

        out << " }";
    }
}